

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test7::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  _variable_type type;
  bool bVar2;
  uchar uVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  _variable_type type_00;
  _variable_type type_01;
  string local_970 [36];
  uint local_94c;
  uint local_948;
  uint row_1;
  uint column_1;
  uint n_columns_1;
  string local_920 [36];
  uint local_8fc;
  uint local_8f8;
  uint row;
  uint column;
  uint n_columns;
  stringstream local_8d0 [8];
  stringstream component_index_sstream;
  ostream local_8c0;
  uint local_744;
  stringstream local_740 [4];
  uint n_component_1;
  stringstream array_index_sstream_1;
  ostream local_730;
  uint local_5b4;
  undefined1 local_5b0 [4];
  uint index_1;
  string variable_type_string_1;
  uint n_variable_type_components_1;
  bool is_variable_type_matrix;
  _variable_type variable_type_1;
  uint variable_array_size_1;
  uint n_variable_1;
  uint expected_value;
  uint n_component;
  stringstream local_550 [8];
  stringstream array_index_sstream;
  ostream local_540;
  uint local_3c4;
  string local_3c0 [4];
  uint index;
  stringstream local_3a0 [8];
  stringstream array_size_sstream;
  ostream local_390;
  undefined1 local_218 [8];
  string variable_type_string;
  uint n_variable_type_components;
  _variable_type variable_type;
  uint variable_array_size;
  uint n_variable;
  size_t n_variables;
  undefined1 local_1d8 [4];
  uint base_counter;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  _variables *local_20;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  local_20 = variables;
  variables_local = (_variables *)this;
  this_local = (GPUShaderFP64Test7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar4 = std::operator<<(&local_198,"#version 400\n\n");
  poVar4 = std::operator<<(poVar4,"in GS_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_((string *)local_1d8,this,"gs",local_20,"flat");
  poVar4 = std::operator<<(poVar4,(string *)local_1d8);
  poVar4 = std::operator<<(poVar4,"};\n\n");
  std::operator<<(poVar4,
                  "out vec4 result;\n\nvoid main()\n{\nconst double epsilon = 1e-5;\n\nresult = vec4(1, 0, 0, 0);\n\n"
                 );
  std::__cxx11::string::~string((string *)local_1d8);
  n_variables._4_4_ = 1;
  sVar5 = std::
          vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ::size(local_20);
  for (variable_type = VARIABLE_TYPE_BOOL; variable_type < sVar5;
      variable_type = variable_type + VARIABLE_TYPE_BVEC2) {
    pvVar6 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type);
    uVar1 = pvVar6->array_size;
    pvVar6 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type);
    variable_type_string.field_2._12_4_ = pvVar6->type;
    variable_type_string.field_2._8_4_ =
         Utils::getNumberOfComponentsForVariableType(variable_type_string.field_2._12_4_);
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)local_218,(Utils *)(ulong)(uint)variable_type_string.field_2._12_4_,type_00
              );
    std::__cxx11::stringstream::stringstream(local_3a0);
    if (1 < uVar1) {
      poVar4 = std::operator<<(&local_390,"[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
      std::operator<<(poVar4,"]");
    }
    poVar4 = std::operator<<(&local_198,(string *)local_218);
    poVar4 = std::operator<<(poVar4," expected_variable");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,variable_type);
    std::__cxx11::stringstream::str();
    poVar4 = std::operator<<(poVar4,local_3c0);
    std::operator<<(poVar4,";\n\n");
    std::__cxx11::string::~string(local_3c0);
    for (local_3c4 = 0; local_3c4 < uVar1; local_3c4 = local_3c4 + 1) {
      std::__cxx11::stringstream::stringstream(local_550);
      if (1 < uVar1) {
        poVar4 = std::operator<<(&local_540,"[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3c4);
        std::operator<<(poVar4,"]");
      }
      poVar4 = std::operator<<(&local_198,"expected_variable");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,variable_type);
      std::__cxx11::stringstream::str();
      poVar4 = std::operator<<(poVar4,(string *)&expected_value);
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::operator<<(poVar4,(string *)local_218);
      std::operator<<(poVar4,"(");
      std::__cxx11::string::~string((string *)&expected_value);
      for (n_variable_1 = 0; n_variable_1 < (uint)variable_type_string.field_2._8_4_;
          n_variable_1 = n_variable_1 + 1) {
        variable_array_size_1 = n_variables._4_4_ * 4 + 6;
        if ((this->m_are_double_inputs_supported & 1U) != 0) {
          variable_array_size_1 = n_variables._4_4_ * 4 + 5;
        }
        std::ostream::operator<<(&local_198,variable_array_size_1);
        if (n_variable_1 != variable_type_string.field_2._8_4_ - 1) {
          std::operator<<(&local_198,", ");
        }
        n_variables._4_4_ = n_variables._4_4_ + 1;
      }
      std::operator<<(&local_198,");\n");
      std::__cxx11::stringstream::~stringstream(local_550);
    }
    std::operator<<(&local_198,"\n");
    std::__cxx11::stringstream::~stringstream(local_3a0);
    std::__cxx11::string::~string((string *)local_218);
  }
  std::operator<<(&local_198,"if (");
  for (variable_type_1 = VARIABLE_TYPE_BOOL; variable_type_1 < sVar5;
      variable_type_1 = variable_type_1 + VARIABLE_TYPE_BVEC2) {
    pvVar6 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type_1);
    uVar1 = pvVar6->array_size;
    pvVar6 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type_1);
    type = pvVar6->type;
    bVar2 = Utils::isMatrixVariableType(type);
    variable_type_string_1.field_2._12_4_ = Utils::getNumberOfComponentsForVariableType(type);
    Utils::getVariableTypeString_abi_cxx11_((string *)local_5b0,(Utils *)(ulong)type,type_01);
    for (local_5b4 = 0; local_5b4 < uVar1; local_5b4 = local_5b4 + 1) {
      std::__cxx11::stringstream::stringstream(local_740);
      if (1 < uVar1) {
        poVar4 = std::operator<<(&local_730,"[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_5b4);
        std::operator<<(poVar4,"]");
      }
      for (local_744 = 0; local_744 < (uint)variable_type_string_1.field_2._12_4_;
          local_744 = local_744 + 1) {
        std::__cxx11::stringstream::stringstream(local_8d0);
        if (1 < (uint)variable_type_string_1.field_2._12_4_) {
          poVar4 = std::operator<<(&local_8c0,"[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_744);
          std::operator<<(poVar4,"]");
        }
        poVar4 = std::operator<<(&local_198,"abs(expected_variable");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,variable_type_1);
        std::__cxx11::stringstream::str();
        std::operator<<(poVar4,(string *)&column);
        std::__cxx11::string::~string((string *)&column);
        if (bVar2) {
          row = Utils::getNumberOfColumnsForVariableType(type);
          local_8f8 = local_744 % row;
          local_8fc = local_744 / row;
          poVar4 = std::operator<<(&local_198,"[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8f8);
          poVar4 = std::operator<<(poVar4,"].");
          uVar3 = Utils::getComponentAtIndex(local_8fc);
          std::operator<<(poVar4,uVar3);
        }
        else {
          std::__cxx11::stringstream::str();
          std::operator<<(&local_198,local_920);
          std::__cxx11::string::~string(local_920);
        }
        poVar4 = std::operator<<(&local_198," - gs_variable");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,variable_type_1);
        std::__cxx11::stringstream::str();
        std::operator<<(poVar4,(string *)&column_1);
        std::__cxx11::string::~string((string *)&column_1);
        if (bVar2) {
          row_1 = Utils::getNumberOfColumnsForVariableType(type);
          local_948 = local_744 % row_1;
          local_94c = local_744 / row_1;
          poVar4 = std::operator<<(&local_198,"[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_948);
          poVar4 = std::operator<<(poVar4,"].");
          uVar3 = Utils::getComponentAtIndex(local_94c);
          std::operator<<(poVar4,uVar3);
        }
        else {
          std::__cxx11::stringstream::str();
          std::operator<<(&local_198,local_970);
          std::__cxx11::string::~string(local_970);
        }
        std::operator<<(&local_198,") <= epsilon &&");
        std::__cxx11::stringstream::~stringstream(local_8d0);
      }
      std::__cxx11::stringstream::~stringstream(local_740);
    }
    std::__cxx11::string::~string((string *)local_5b0);
  }
  std::operator<<(&local_198,"true)\n{\n    result = vec4(0, 1, 0, 0);\n}\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getFragmentShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"

				   /* Add input block */
				   << "in GS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("gs", variables, "flat") << "};\n"
																		  "\n"

				   /* Add output variable */
				   << "out vec4 result;\n"
					  "\n"

					  /* Add main() definition */
					  "void main()\n"
					  "{\n"
					  "const double epsilon = 1e-5;\n"
					  "\n"
					  "result = vec4(1, 0, 0, 0);\n"
					  "\n";

	/* Determine expected values first */
	unsigned int base_counter = 1;
	const size_t n_variables  = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		std::stringstream array_size_sstream;

		if (variable_array_size > 1)
		{
			array_size_sstream << "[" << variable_array_size << "]";
		}

		/* Local variable declaration */
		result_sstream << variable_type_string << " expected_variable" << n_variable << array_size_sstream.str()
					   << ";\n"
						  "\n";

		/* Set expected values */
		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			result_sstream << "expected_variable" << n_variable << array_index_sstream.str() << " = "
						   << variable_type_string << "(";

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				unsigned int expected_value =
					(base_counter + 0) + (base_counter + 1) + (base_counter + 2) + (base_counter + 3);

				if (m_are_double_inputs_supported)
				{
					/* VS input attributes */
					//expected_value += (base_counter + 6);
					expected_value -= 1;
				}

				result_sstream << expected_value;

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}

				++base_counter;
			} /* for (all components) */

			result_sstream << ");\n";
		} /* for (all array indices) */

		result_sstream << "\n";
	} /* for (all variable types) */

	/* Now that we know the expected values, do a huge conditional check to verify if all
	 * input variables carry correct information.
	 */
	result_sstream << "if (";

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		bool				  is_variable_type_matrix	= Utils::isMatrixVariableType(variable_type);
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				std::stringstream component_index_sstream;

				if (n_variable_type_components > 1)
				{
					component_index_sstream << "[" << n_component << "]";
				}

				result_sstream << "abs(expected_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << " - gs_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << ") <= epsilon &&";
			} /* for (all components) */
		}	 /* for (all array indices) */
	}		  /* for (all variable types) */

	result_sstream << "true)\n"
					  "{\n"
					  "    result = vec4(0, 1, 0, 0);\n"
					  "}\n"
					  "}\n";

	/* All done */
	return result_sstream.str();
}